

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void AppendAttribute(cmXMLWriter *xml,char *keyval)

{
  allocator<char> local_39;
  char *local_38;
  string local_30;
  
  local_38 = keyval;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"attribute",&local_39);
  cmXMLWriter::StartElement(xml,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  cmXMLWriter::Attribute<char_const*>(xml,"key",&local_38);
  cmXMLWriter::Attribute<char_const*>(xml,"value",&local_38);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

static void AppendAttribute(cmXMLWriter& xml, const char* keyval)
{
  xml.StartElement("attribute");
  xml.Attribute("key", keyval);
  xml.Attribute("value", keyval);
  xml.EndElement();
}